

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O0

Vec_Vec_t * Cgt_ManDecideSimple(Aig_Man_t *pAig,Vec_Vec_t *vGatesAll,int nOdcMax,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Vec_t *p;
  Ssw_Sml_t *p_00;
  Aig_Obj_t *pObjLi_00;
  Aig_Obj_t *pObjLo_00;
  Vec_Ptr_t *p_01;
  Aig_Obj_t *pCand_00;
  abctime aVar5;
  float fVar6;
  int nTransSaved;
  int nTransTotal;
  abctime clk;
  int local_70;
  int Counter;
  int nHitsMax;
  int nHitsCur;
  int k;
  int i;
  Aig_Obj_t *pCandBest;
  Aig_Obj_t *pCand;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Vec_Ptr_t *vCands;
  Vec_Vec_t *vGates;
  Ssw_Sml_t *pSml;
  int nWords;
  int nFrames;
  int fVerbose_local;
  int nOdcMax_local;
  Vec_Vec_t *vGatesAll_local;
  Aig_Man_t *pAig_local;
  
  clk._4_4_ = 0;
  aVar4 = Abc_Clock();
  iVar1 = Saig_ManRegNum(pAig);
  p = Vec_VecStart(iVar1);
  p_00 = Ssw_SmlSimulateSeq(pAig,0,0x20,1);
  for (nHitsCur = 0; iVar1 = Saig_ManRegNum(pAig), nHitsCur < iVar1; nHitsCur = nHitsCur + 1) {
    pObjLi_00 = Saig_ManLi(pAig,nHitsCur);
    pObjLo_00 = Saig_ManLo(pAig,nHitsCur);
    local_70 = 0;
    _k = (Aig_Obj_t *)0x0;
    p_01 = Vec_VecEntry(vGatesAll,nHitsCur);
    for (nHitsMax = 0; iVar1 = Vec_PtrSize(p_01), nHitsMax < iVar1; nHitsMax = nHitsMax + 1) {
      pCand_00 = (Aig_Obj_t *)Vec_PtrEntry(p_01,nHitsMax);
      if ((nOdcMax == 0) &&
         (iVar1 = Ssw_SmlCheckXorImplication(p_00,pObjLi_00,pObjLo_00,pCand_00), iVar1 == 0)) {
        printf("Clock gate candidate is invalid!\n");
      }
      iVar1 = Ssw_SmlNodeCountOnesReal(p_00,pCand_00);
      if (local_70 < iVar1) {
        local_70 = iVar1;
        _k = pCand_00;
      }
    }
    if (_k != (Aig_Obj_t *)0x0) {
      Vec_VecPush(p,nHitsCur,_k);
      clk._4_4_ = clk._4_4_ + 1;
    }
  }
  Ssw_SmlStop(p_00);
  if (fVerbose != 0) {
    uVar2 = Vec_VecSizeSize(vGatesAll);
    uVar3 = Saig_ManRegNum(pAig);
    printf("Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n",(ulong)uVar2,
           (ulong)clk._4_4_,(ulong)uVar3);
    fVar6 = Cgt_ManComputeCoverage(pAig,p);
    printf("Gated transitions = %5.2f %%. ",(double)fVar6);
    Abc_Print(1,"%s =","Time");
    aVar5 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
  }
  return p;
}

Assistant:

Vec_Vec_t * Cgt_ManDecideSimple( Aig_Man_t * pAig, Vec_Vec_t * vGatesAll, int nOdcMax, int fVerbose )
{
    int nFrames = 32;
    int nWords  =  1;
    Ssw_Sml_t * pSml;
    Vec_Vec_t * vGates;
    Vec_Ptr_t * vCands;
    Aig_Obj_t * pObjLi, * pObjLo, * pCand, * pCandBest;
    int i, k, nHitsCur, nHitsMax, Counter = 0;
    abctime clk = Abc_Clock();
    int nTransTotal = 0, nTransSaved = 0;
    vGates = Vec_VecStart( Saig_ManRegNum(pAig) );
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        nHitsMax = 0;
        pCandBest = NULL;
        vCands = Vec_VecEntry( vGatesAll, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pCand, k )
        {
            // check if this is indeed a clock-gate
            if ( nOdcMax == 0 && !Ssw_SmlCheckXorImplication( pSml, pObjLi, pObjLo, pCand ) )
                printf( "Clock gate candidate is invalid!\n" );
            // find its characteristic number
            nHitsCur = Ssw_SmlNodeCountOnesReal( pSml, pCand );
            if ( nHitsMax < nHitsCur )
            {
                nHitsMax = nHitsCur;
                pCandBest = pCand;
            }
        }
        if ( pCandBest != NULL )
        {
            Vec_VecPush( vGates, i, pCandBest );
            Counter++;
            nTransSaved += nHitsMax;
        }
        nTransTotal += 32 * nFrames * nWords;
    }
    Ssw_SmlStop( pSml );
    if ( fVerbose )
    {
        printf( "Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n", 
            Vec_VecSizeSize(vGatesAll), Counter, Saig_ManRegNum(pAig) );
//        printf( "Gated transitions = %5.2f %%. (%5.2f %%.) ", 
//            100.0*nTransSaved/nTransTotal, Cgt_ManComputeCoverage(pAig, vGates) );
        printf( "Gated transitions = %5.2f %%. ", Cgt_ManComputeCoverage(pAig, vGates) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
/*
    {
        Vec_Ptr_t * vCompletes;
        vCompletes = Cgt_ManCompleteGates( pAig, vGatesAll, nOdcMax, fVerbose );
        printf( "Complete gates = %d. \n", Vec_PtrSize(vCompletes) );
        Vec_PtrFree( vCompletes );
    }
*/
    return vGates;
}